

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O1

bool __thiscall
capnp::compiler::ValueTranslator::matchesType
          (ValueTranslator *this,Reader src,Type type,Orphan<capnp::DynamicValue> *result)

{
  long lVar1;
  uint uVar2;
  int64_t iVar3;
  EnumSchema EVar4;
  StructSchema SVar5;
  uint64_t uVar6;
  anon_union_2_2_d12d5221_for_Type_3 aVar7;
  uint uVar8;
  ulong uVar9;
  byte unaff_BPL;
  undefined8 uVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  ReaderFor<DynamicEnum> RVar14;
  Type local_e8;
  Reader local_d8;
  Schema local_90;
  anon_union_8_2_eba6ea51_for_Type_5 aStack_88;
  Type local_80;
  ReaderFor<DynamicList> local_70;
  
  local_e8.field_4 = type.field_4;
  uVar10 = type._0_8_;
  local_e8.listDepth = type.listDepth;
  local_e8.isImplicitParam = type.isImplicitParam;
  local_e8.baseType = type.baseType;
  local_e8.field_3 = type.field_3;
  local_e8._0_8_ = uVar10;
  switch(result->type) {
  default:
switchD_003e2f4b_caseD_0:
    kj::_::unreachable();
  case VOID:
    bVar13 = local_e8.baseType == VOID;
    break;
  case BOOL:
    bVar13 = local_e8.baseType == BOOL;
    break;
  case INT:
    Orphan<capnp::DynamicValue>::getReader(&local_d8,result);
    iVar3 = DynamicValue::Reader::AsImpl<long,_(capnp::Kind)0>::apply(&local_d8);
    DynamicValue::Reader::~Reader(&local_d8);
    if (iVar3 < 0) {
      uVar8 = local_e8._0_4_ - 2;
      uVar2 = 0xc;
      if (local_e8.listDepth == '\0') {
        uVar2 = uVar8;
      }
      if ((ushort)uVar2 < 10) {
        lVar1 = *(long *)(&DAT_005a3768 + (ulong)(uVar2 & 0xffff) * 8);
        unaff_BPL = 1;
        if (iVar3 < lVar1) {
          uVar9 = 0;
          uVar11 = 0;
          if (0x3f < src._reader.dataSize) {
            uVar11 = (ulong)*(uint *)((long)src._reader.data + 4);
          }
          if (0x9f < src._reader.dataSize) {
            uVar9 = (ulong)*(uint *)((long)src._reader.data + 0x10);
          }
          (**this->errorReporter->_vptr_ErrorReporter)
                    (this->errorReporter,uVar11,uVar9,"Integer value out of range.",0x1c);
          local_d8.type = INT;
          local_d8.field_1.listValue.reader.segment = (SegmentReader *)0x0;
          local_d8.field_1.listValue.reader.capTable = (CapTableReader *)0x0;
          local_d8.field_1.listValue.reader.ptr = (byte *)0x0;
          local_d8.field_1._40_8_ = (word *)0x0;
          *(size_t *)((long)&result->field_1 + 8) =
               local_d8.field_1.textValue.super_StringPtr.content.size_;
          result->type = INT;
          *(undefined4 *)&result->field_0x4 = local_d8._4_4_;
          (result->field_1).intValue = lVar1;
          local_d8.field_1.intValue = lVar1;
          if ((result->builder).segment != (SegmentBuilder *)0x0) {
            capnp::_::OrphanBuilder::euthanize(&result->builder);
          }
          (result->builder).segment = (SegmentBuilder *)local_d8.field_1.listValue.reader.capTable;
          (result->builder).capTable = (CapTableBuilder *)local_d8.field_1.listValue.reader.ptr;
          (result->builder).location = (word *)local_d8.field_1._40_8_;
          (result->builder).tag.content = (uint64_t)local_d8.field_1.listValue.reader.segment;
        }
      }
      else {
        unaff_BPL = 0;
      }
    }
    uVar10 = local_e8._0_8_;
    if (iVar3 < 0) goto LAB_003e3395;
  case UINT:
    local_e8._0_8_ = uVar10;
    uVar8 = local_e8._0_4_ - 2;
    uVar2 = 0xc;
    if (local_e8.listDepth == '\0') {
      uVar2 = uVar8;
    }
    if ((ushort)uVar2 < 10) {
      uVar9 = *(ulong *)(&DAT_005a37b8 + (ulong)(uVar2 & 0xffff) * 8);
      Orphan<capnp::DynamicValue>::getReader(&local_d8,result);
      uVar6 = DynamicValue::Reader::AsImpl<unsigned_long,_(capnp::Kind)0>::apply(&local_d8);
      DynamicValue::Reader::~Reader(&local_d8);
      unaff_BPL = 1;
      if (uVar9 < uVar6) {
        uVar11 = 0;
        uVar12 = 0;
        if (0x3f < src._reader.dataSize) {
          uVar12 = (ulong)*(uint *)((long)src._reader.data + 4);
        }
        if (0x9f < src._reader.dataSize) {
          uVar11 = (ulong)*(uint *)((long)src._reader.data + 0x10);
        }
        (**this->errorReporter->_vptr_ErrorReporter)
                  (this->errorReporter,uVar12,uVar11,"Integer value out of range.",0x1c);
        local_d8.type = UINT;
        local_d8.field_1.listValue.reader.segment = (SegmentReader *)0x0;
        local_d8.field_1.listValue.reader.capTable = (CapTableReader *)0x0;
        local_d8.field_1.listValue.reader.ptr = (byte *)0x0;
        local_d8.field_1._40_8_ = (word *)0x0;
        *(size_t *)((long)&result->field_1 + 8) =
             local_d8.field_1.textValue.super_StringPtr.content.size_;
        result->type = UINT;
        *(undefined4 *)&result->field_0x4 = local_d8._4_4_;
        (result->field_1).uintValue = uVar9;
        if ((result->builder).segment != (SegmentBuilder *)0x0) {
          local_d8.field_1.uintValue = uVar9;
          capnp::_::OrphanBuilder::euthanize(&result->builder);
        }
        (result->builder).segment = (SegmentBuilder *)local_d8.field_1.listValue.reader.capTable;
        (result->builder).capTable = (CapTableBuilder *)local_d8.field_1.listValue.reader.ptr;
        (result->builder).location = (word *)local_d8.field_1._40_8_;
        (result->builder).tag.content = (uint64_t)local_d8.field_1.listValue.reader.segment;
      }
    }
    else {
      unaff_BPL = 0;
    }
    goto LAB_003e3395;
  case FLOAT:
    unaff_BPL = 1;
    if (local_e8.baseType != FLOAT32 || local_e8.listDepth != '\0') {
      unaff_BPL = local_e8.baseType == FLOAT64 && local_e8.listDepth == '\0';
    }
    goto LAB_003e3395;
  case TEXT:
    bVar13 = local_e8.baseType == TEXT;
    break;
  case DATA:
    bVar13 = local_e8.baseType == DATA;
    break;
  case LIST:
    if (local_e8.listDepth == '\0') {
      unaff_BPL = 0;
      if (local_e8.baseType == ANY_POINTER) {
        aVar7.paramIndex = 0;
        if (local_e8.field_4.schema == (RawBrandedSchema *)0x0) {
          aVar7.paramIndex = local_e8.field_3.paramIndex;
        }
        if (local_e8.isImplicitParam != false) {
          aVar7.paramIndex = 0;
        }
        if (3 < aVar7.paramIndex) goto switchD_003e2f4b_caseD_0;
        unaff_BPL = (byte)aVar7.paramIndex ^ 1;
      }
      goto LAB_003e3395;
    }
    Orphan<capnp::DynamicValue>::getReader(&local_d8,result);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&local_70,&local_d8);
    local_90.raw = (RawBrandedSchema *)local_70.schema.elementType._0_8_;
    aStack_88 = local_70.schema.elementType.field_4;
    local_80 = (Type)Type::asList(&local_e8);
    unaff_BPL = Type::operator==((Type *)&local_90,&local_80);
    goto LAB_003e31e8;
  case ENUM:
    if (local_e8.listDepth != '\0' || local_e8.baseType != ENUM) {
      unaff_BPL = 0;
      goto LAB_003e3395;
    }
    Orphan<capnp::DynamicValue>::getReader(&local_d8,result);
    RVar14 = DynamicValue::Reader::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply(&local_d8);
    EVar4 = Type::asEnum(&local_e8);
    unaff_BPL = (RawBrandedSchema *)RVar14.schema.super_Schema.raw == EVar4.super_Schema.raw;
    goto LAB_003e31e8;
  case STRUCT:
    if (local_e8.listDepth != '\0' || local_e8.baseType != STRUCT) {
      unaff_BPL = 0;
      if (local_e8.baseType == ANY_POINTER && local_e8.listDepth == '\0') {
        aVar7.paramIndex = 0;
        if (local_e8.field_4.schema == (RawBrandedSchema *)0x0) {
          aVar7.paramIndex = local_e8.field_3.paramIndex;
        }
        if (local_e8.isImplicitParam != false) {
          aVar7.paramIndex = 0;
        }
        if (3 < aVar7.paramIndex) goto switchD_003e2f4b_caseD_0;
        unaff_BPL = 3 >> ((byte)aVar7.paramIndex & 0xf);
      }
      goto LAB_003e3395;
    }
    Orphan<capnp::DynamicValue>::getReader(&local_d8,result);
    DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicStruct> *)&local_70,&local_d8);
    SVar5 = Type::asStruct(&local_e8);
    unaff_BPL = (Schema)local_70.schema.elementType._0_8_ == SVar5.super_Schema.raw;
LAB_003e31e8:
    DynamicValue::Reader::~Reader(&local_d8);
    goto LAB_003e3395;
  case CAPABILITY:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[38]>
              ((Fault *)&local_d8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
               ,0x7e7,FAILED,(char *)0x0,"\"Interfaces can\'t have literal values.\"",
               (char (*) [38])"Interfaces can\'t have literal values.");
    kj::_::Debug::Fault::fatal((Fault *)&local_d8);
  case ANY_POINTER:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[39]>
              ((Fault *)&local_d8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
               ,0x7ea,FAILED,(char *)0x0,"\"AnyPointers can\'t have literal values.\"",
               (char (*) [39])"AnyPointers can\'t have literal values.");
    kj::_::Debug::Fault::fatal((Fault *)&local_d8);
  }
  unaff_BPL = local_e8.listDepth == '\0' & bVar13;
LAB_003e3395:
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool ValueTranslator::matchesType(Expression::Reader src, Type type, Orphan<DynamicValue>& result) {
  // compileValueInner() evaluated `src` and only used `type` as a hint in interpreting `src` if
  // `src`'s type wasn't already obvious. So, now we need to check that the resulting value
  // actually matches `type`.

  switch (result.getType()) {
    case DynamicValue::UNKNOWN:
      KJ_UNREACHABLE;

    case DynamicValue::VOID:
      return type.isVoid();

    case DynamicValue::BOOL:
      return type.isBool();

    case DynamicValue::INT: {
      int64_t value = result.getReader().as<int64_t>();
      if (value < 0) {
        int64_t minValue;
        switch (type.which()) {
          case schema::Type::INT8: minValue = (int8_t)kj::minValue; break;
          case schema::Type::INT16: minValue = (int16_t)kj::minValue; break;
          case schema::Type::INT32: minValue = (int32_t)kj::minValue; break;
          case schema::Type::INT64: minValue = (int64_t)kj::minValue; break;
          case schema::Type::UINT8: minValue = (uint8_t)kj::minValue; break;
          case schema::Type::UINT16: minValue = (uint16_t)kj::minValue; break;
          case schema::Type::UINT32: minValue = (uint32_t)kj::minValue; break;
          case schema::Type::UINT64: minValue = (uint64_t)kj::minValue; break;

          case schema::Type::FLOAT32:
          case schema::Type::FLOAT64:
            // Any integer is acceptable.
            minValue = (int64_t)kj::minValue;
            break;

          default: return false;
        }

        if (value < minValue) {
          errorReporter.addErrorOn(src, "Integer value out of range.");
          result = minValue;
        }
        return true;
      }

    } KJ_FALLTHROUGH;  // value is positive, so we can just go on to the uint case below.

    case DynamicValue::UINT: {
      uint64_t maxValue;
      switch (type.which()) {
        case schema::Type::INT8: maxValue = (int8_t)kj::maxValue; break;
        case schema::Type::INT16: maxValue = (int16_t)kj::maxValue; break;
        case schema::Type::INT32: maxValue = (int32_t)kj::maxValue; break;
        case schema::Type::INT64: maxValue = (int64_t)kj::maxValue; break;
        case schema::Type::UINT8: maxValue = (uint8_t)kj::maxValue; break;
        case schema::Type::UINT16: maxValue = (uint16_t)kj::maxValue; break;
        case schema::Type::UINT32: maxValue = (uint32_t)kj::maxValue; break;
        case schema::Type::UINT64: maxValue = (uint64_t)kj::maxValue; break;

        case schema::Type::FLOAT32:
        case schema::Type::FLOAT64:
          // Any integer is acceptable.
          maxValue = (uint64_t)kj::maxValue;
          break;

        default: return false;
      }

      if (result.getReader().as<uint64_t>() > maxValue) {
        errorReporter.addErrorOn(src, "Integer value out of range.");
        result = maxValue;
      }
      return true;
    }

    case DynamicValue::FLOAT:
      return type.isFloat32() || type.isFloat64();

    case DynamicValue::TEXT:
      return type.isText();

    case DynamicValue::DATA:
      return type.isData();

    case DynamicValue::LIST:
      if (type.isList()) {
        return result.getReader().as<DynamicList>().getSchema() == type.asList();
      } else if (type.isAnyPointer()) {
        switch (type.whichAnyPointerKind()) {
          case schema::Type::AnyPointer::Unconstrained::ANY_KIND:
          case schema::Type::AnyPointer::Unconstrained::LIST:
            return true;
          case schema::Type::AnyPointer::Unconstrained::STRUCT:
          case schema::Type::AnyPointer::Unconstrained::CAPABILITY:
            return false;
        }
        KJ_UNREACHABLE;
      } else {
        return false;
      }

    case DynamicValue::ENUM:
      return type.isEnum() &&
             result.getReader().as<DynamicEnum>().getSchema() == type.asEnum();

    case DynamicValue::STRUCT:
      if (type.isStruct()) {
        return result.getReader().as<DynamicStruct>().getSchema() == type.asStruct();
      } else if (type.isAnyPointer()) {
        switch (type.whichAnyPointerKind()) {
          case schema::Type::AnyPointer::Unconstrained::ANY_KIND:
          case schema::Type::AnyPointer::Unconstrained::STRUCT:
            return true;
          case schema::Type::AnyPointer::Unconstrained::LIST:
          case schema::Type::AnyPointer::Unconstrained::CAPABILITY:
            return false;
        }
        KJ_UNREACHABLE;
      } else {
        return false;
      }

    case DynamicValue::CAPABILITY:
      KJ_FAIL_ASSERT("Interfaces can't have literal values.");

    case DynamicValue::ANY_POINTER:
      KJ_FAIL_ASSERT("AnyPointers can't have literal values.");
  }

  KJ_UNREACHABLE;
}